

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFObjectParser.cpp
# Opt level: O0

bool __thiscall PDFObjectParser::IsNumber(PDFObjectParser *this,string *inToken)

{
  bool bVar1;
  long lVar2;
  char *pcVar3;
  reference pcVar4;
  bool local_43;
  byte local_42;
  bool local_41;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  const_iterator it;
  bool dotEncountered;
  bool isNumber;
  string *inToken_local;
  PDFObjectParser *this_local;
  
  lVar2 = std::__cxx11::string::size();
  if (lVar2 == 0) {
    return false;
  }
  pcVar3 = (char *)std::__cxx11::string::at((ulong)inToken);
  if ((((*pcVar3 != '+') &&
       (pcVar3 = (char *)std::__cxx11::string::at((ulong)inToken), *pcVar3 != '-')) &&
      (pcVar3 = (char *)std::__cxx11::string::at((ulong)inToken), *pcVar3 != '.')) &&
     ((pcVar3 = (char *)std::__cxx11::string::at((ulong)inToken), '9' < *pcVar3 ||
      (pcVar3 = (char *)std::__cxx11::string::at((ulong)inToken), *pcVar3 < '0')))) {
    return false;
  }
  it._M_current._7_1_ = 1;
  pcVar3 = (char *)std::__cxx11::string::at((ulong)inToken);
  it._M_current._6_1_ = *pcVar3 == '.';
  local_30._M_current = (char *)std::__cxx11::string::begin();
  __gnu_cxx::
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::operator++(&local_30);
  pcVar3 = (char *)std::__cxx11::string::at((ulong)inToken);
  if (*pcVar3 != '+') {
    pcVar3 = (char *)std::__cxx11::string::at((ulong)inToken);
    local_41 = false;
    if (*pcVar3 != '-') goto LAB_0024f81b;
  }
  local_38._M_current = (char *)std::__cxx11::string::end();
  local_41 = __gnu_cxx::operator==(&local_30,&local_38);
LAB_0024f81b:
  if (local_41 == false) {
    while( true ) {
      local_40._M_current = (char *)std::__cxx11::string::end();
      bVar1 = __gnu_cxx::operator!=(&local_30,&local_40);
      local_42 = 0;
      if (bVar1) {
        local_42 = it._M_current._7_1_;
      }
      if ((local_42 & 1) == 0) break;
      pcVar4 = __gnu_cxx::
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&local_30);
      if (*pcVar4 == '.') {
        if ((it._M_current._6_1_ & 1) != 0) {
          it._M_current._7_1_ = 0;
        }
        it._M_current._6_1_ = 1;
      }
      else {
        pcVar4 = __gnu_cxx::
                 __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&local_30);
        local_43 = false;
        if ('/' < *pcVar4) {
          pcVar4 = __gnu_cxx::
                   __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*(&local_30);
          local_43 = *pcVar4 < ':';
        }
        it._M_current._7_1_ = local_43;
      }
      __gnu_cxx::
      __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&local_30);
    }
    this_local._7_1_ = (bool)(it._M_current._7_1_ & 1);
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool PDFObjectParser::IsNumber(const std::string& inToken)
{
	if(inToken.size() < 1)
		return false;

	// it's a number if the first char is either a sign or digit, or an initial decimal dot, and the rest is 
	// digits, with the exception of a dot which can appear just once.
	if(inToken.at(0) != scPlus && inToken.at(0) != scMinus && inToken.at(0) != scDot && (inToken.at(0) > scNine || inToken.at(0) < scZero))
		return false;

	bool isNumber = true;
	bool dotEncountered = (inToken.at(0) == scDot);
	std::string::const_iterator it = inToken.begin();
	++it; //verified the first char already

	// only sign is not a number
	if((inToken.at(0) == scPlus || inToken.at(0) == scMinus) && it == inToken.end())
		return false;

	for(; it != inToken.end() && isNumber;++it)
	{
		if(*it == scDot)
		{
			if(dotEncountered)
			{
				isNumber = false;
			}
			dotEncountered = true;
		}
		else
			isNumber = (scZero <= *it && *it <= scNine);
	}
	return isNumber;
}